

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink.h
# Opt level: O1

filename_t *
spdlog::sinks::rotating_file_sink<std::mutex>::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,size_t index)

{
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  filename_t basename;
  filename_t ext;
  char *local_2c8;
  size_type sStack_2c0;
  char local_2b8;
  undefined7 uStack_2b7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  size_type sStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [32];
  _Alloc_hider local_268;
  size_type sStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  lStack_238 = 0;
  local_248 = &PTR_grow_001e6e30;
  local_230 = 500;
  local_240 = local_228;
  if (index == 0) {
    local_288._0_8_ = (filename->_M_dataplus)._M_p;
    local_288._8_8_ = filename->_M_string_length;
    format_str_00.size_ = 2;
    format_str_00.data_ = "{}";
    args_00.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_288;
    args_00.types_ = 0xb;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_248,format_str_00,args_00);
  }
  else {
    local_2c8 = &local_2b8;
    sStack_2c0 = 0;
    local_2b8 = '\0';
    sStack_2a0 = 0;
    local_298._M_local_buf[0] = '\0';
    local_2a8 = &local_298;
    details::file_helper::split_by_extenstion
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_288,filename);
    std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_268);
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != &local_258) {
      operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
    local_288._0_8_ = local_2c8;
    local_288._8_8_ = sStack_2c0;
    local_268._M_p = (pointer)local_2a8;
    sStack_260 = sStack_2a0;
    format_str.size_ = 7;
    format_str.data_ = "{}.{}{}";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_288;
    args.types_ = 0xb5b;
    local_288._16_8_ = index;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_248,format_str,args);
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,
                      CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) + 1)
      ;
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_240,local_240 + lStack_238);
  local_248 = &PTR_grow_001e6e30;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, std::size_t index)
    {
        typename std::conditional<std::is_same<filename_t::value_type, char>::value, fmt::memory_buffer, fmt::wmemory_buffer>::type w;
        if (index != 0u)
        {
            filename_t basename, ext;
            std::tie(basename, ext) = details::file_helper::split_by_extenstion(filename);
            fmt::format_to(w, SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
        }
        else
        {
            fmt::format_to(w, SPDLOG_FILENAME_T("{}"), filename);
        }
        return fmt::to_string(w);
    }